

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots_approx
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          long Npoints)

{
  ulong uVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  double dVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *this_01;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar5;
  undefined8 *puVar6;
  char *__function;
  long lVar7;
  double dVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  VectorXd xpts_n11;
  VectorXd abc;
  VectorXd ypts;
  double _x;
  Vector3d r;
  double x;
  Matrix3d A;
  void *local_248;
  long local_240;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> local_238;
  double local_210;
  vector<double,std::allocator<double>> *local_208;
  ulong local_200;
  undefined1 local_1f8 [32];
  double *local_1d8;
  SrcXprType local_1d0;
  ulong local_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  Matrix<double,_3,_1,_0,_3,_1> local_190;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_178;
  double *local_78;
  double dStack_70;
  double **local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._16_8_ = this;
  if (Npoints < -1) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = (double)(Npoints + 1);
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = (double)Npoints;
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 0.0;
  if (Npoints != 0) {
    local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
               .m_data.array[6] /
               local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
               .m_data.array[6];
  }
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = (double)(Npoints + (ulong)(Npoints == 0));
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  local_178.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0]._0_1_ = 0;
  local_178.m_colsPermutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0x54442d18;
  local_178.m_colsPermutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = 0x400921fb;
  local_208 = (vector<double,std::allocator<double>> *)__return_storage_ptr__;
  local_178.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
  local_178.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] =
       (long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
  local_178.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] =
       (long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_248,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)&local_178);
  y_recurrence_xscaled((ChebyshevExpansion *)local_1f8,(vectype *)local_1f8._16_8_);
  uVar11 = Npoints - 1;
  if (uVar11 != 0) {
    uVar9 = 0;
    local_1c0 = uVar11;
    do {
      lVar10 = 0;
      if (uVar9 != 0) {
        lVar10 = uVar9 - 1;
      }
      if (((long)local_1f8._8_8_ <= (long)uVar9) ||
         (uVar1 = uVar9 + 1, (ulong)local_1f8._8_8_ <= uVar1)) goto LAB_0013349c;
      if ((long)((ulong)*(double *)(local_1f8._0_8_ + uVar1 * 8) ^
                (ulong)*(double *)(local_1f8._0_8_ + uVar9 * 8)) < 0) {
        if (local_240 <= (long)uVar9) {
LAB_0013349c:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        uVar11 = 0;
        if (uVar9 != 0) {
          uVar11 = uVar9 - 1;
        }
        if ((ulong)local_1f8._8_8_ <= uVar11) goto LAB_0013349c;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[1] = 0.0;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[2] = 4.94065645841247e-324;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[3] = 4.94065645841247e-324;
        local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = *(double *)(local_1f8._0_8_ + uVar11 * 8);
        local_200 = uVar9;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[0] = (double)&local_190;
        if ((ulong)local_1f8._8_8_ <= uVar11 + 1) goto LAB_0013349c;
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_178,
                             (Scalar *)(local_1f8._0_8_ + (uVar11 + 1) * 8));
        if ((long)local_1f8._8_8_ <= (long)(uVar11 + 2)) goto LAB_0013349c;
        Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                  (this_00,(Scalar *)(local_1f8._0_8_ + (uVar11 + 2) * 8));
        if (((long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[3] +
             (long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[1] != 3) ||
           ((double **)
            local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[2] != (double **)0x1)) {
          __function = 
          "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
          ;
LAB_001334d0:
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                        ,0x7c,__function);
        }
        lVar7 = 3;
        pdVar12 = (double *)&local_78;
        dVar8 = 0.0;
        do {
          if (local_240 <= lVar10) goto LAB_0013349c;
          local_1d0.m_dec =
               *(ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> **)
                ((long)local_248 + lVar10 * 8);
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[2] = (double)&local_78;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[4] = 0.0;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[5] = 4.94065645841247e-324;
          local_238.m_xpr = (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)&local_178;
          local_238.m_row = 0;
          local_238.m_col = 1;
          local_238.m_currentBlockRows = 1;
          *pdVar12 = (double)local_1d0.m_dec * (double)local_1d0.m_dec;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[0] = (double)pdVar12;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[3] = dVar8;
          this_01 = Eigen::
                    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                    ::operator_(&local_238,(Scalar *)&local_1d0);
          local_1d8 = (double *)0x3ff0000000000000;
          Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
          ::operator_(this_01,(Scalar *)&local_1d8);
          if ((local_238.m_currentBlockRows + local_238.m_row != 1) || (local_238.m_col != 3)) {
            __function = 
            "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>]"
            ;
            goto LAB_001334d0;
          }
          dVar8 = (double)((long)dVar8 + 1);
          lVar10 = lVar10 + 1;
          pdVar12 = pdVar12 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        local_178.m_isInitialized = false;
        local_178.m_usePrescribedThreshold = false;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[0] = (double)local_78;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[1] = dStack_70;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[2] = (double)local_68;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[3] = dStack_60;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[4] = local_58;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[5] = dStack_50;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[6] = local_48;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[7] = dStack_40;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[8] = local_38;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::computeInPlace
                  (&local_178);
        uVar11 = local_1c0;
        __return_storage_ptr__ = (vector<double,_std::allocator<double>_> *)local_208;
        if (local_178.m_isInitialized == false) {
          __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/SolverBase.h"
                        ,0x96,
                        "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 3, 1>>]"
                       );
        }
        local_1d0.m_dec = &local_178;
        local_238.m_xpr = (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)0x0;
        local_238.m_row = 0;
        local_1d0.m_rhs = &local_190;
        pCVar5 = (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)malloc(0x18);
        if (((ulong)pCVar5 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pCVar5 == (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x0) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = std::random_device::_M_fini;
          __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_238.m_row = 3;
        local_238.m_xpr = (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)pCVar5;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,&local_1d0,
              (assign_op<double,_double> *)&local_1d8);
        if (((local_238.m_row < 1) || (local_238.m_row == 1)) || ((ulong)local_238.m_row < 3)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_1f8._24_8_ =
             (((MatrixType *)
              &(local_238.m_xpr)->
               super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>)->
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
        ;
        local_1b8 = (((MatrixType *)
                     &(local_238.m_xpr)->
                      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                     )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[1];
        dVar4 = local_1b8 * local_1b8 +
                (double)local_1f8._24_8_ * -4.0 *
                (((MatrixType *)
                 &(local_238.m_xpr)->
                  super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>)
                ->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[2];
        dVar8 = SQRT(dVar4);
        uStack_1b0 = 0;
        dVar18 = dVar8;
        if (dVar4 < 0.0) {
          uStack_1a0 = 0;
          local_210 = dVar8;
          local_1a8 = dVar4;
          dVar8 = sqrt(dVar4);
          dVar18 = local_210;
          dVar4 = local_1a8;
        }
        if (dVar4 < 0.0) {
          local_210 = dVar8;
          dVar18 = sqrt(dVar4);
          dVar8 = local_210;
        }
        if ((local_240 <= (long)local_200) || (local_240 <= (long)uVar1)) goto LAB_0013349c;
        dVar19 = (dVar8 - local_1b8) / ((double)local_1f8._24_8_ + (double)local_1f8._24_8_);
        dVar8 = *(double *)((long)local_248 + local_200 * 8);
        dVar4 = *(double *)((long)local_248 + uVar1 * 8);
        uVar14 = (undefined4)((ulong)dVar4 >> 0x20);
        uVar15 = (undefined4)((ulong)dVar8 >> 0x20);
        uVar13 = SUB84(dVar4,0);
        uVar16 = uVar14;
        if (dVar8 <= dVar4) {
          uVar13 = SUB84(dVar8,0);
          uVar16 = uVar15;
        }
        if ((double)CONCAT44(uVar16,uVar13) <= dVar19) {
          dVar17 = dVar4;
          if (dVar4 <= dVar8) {
            dVar17 = dVar8;
          }
          bVar2 = dVar19 <= dVar17;
        }
        else {
          bVar2 = false;
        }
        dVar18 = (-local_1b8 - dVar18) / ((double)local_1f8._24_8_ + (double)local_1f8._24_8_);
        if ((double)CONCAT44(uVar16,uVar13) <= dVar18) {
          uVar13 = SUB84(dVar4,0);
          if (dVar4 <= dVar8) {
            uVar13 = SUB84(dVar8,0);
            uVar14 = uVar15;
          }
          bVar3 = dVar18 <= (double)CONCAT44(uVar14,uVar13);
        }
        else {
          bVar3 = false;
        }
        if (((bVar3) || (!bVar2)) && (dVar19 = dVar18, (bool)(bVar2 | bVar3 ^ 1U))) {
          dVar19 = 1e+99;
        }
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[0] = (*(double *)(local_1f8._16_8_ + 0x18) + *(double *)(local_1f8._16_8_ + 0x10) +
                    (*(double *)(local_1f8._16_8_ + 0x18) - *(double *)(local_1f8._16_8_ + 0x10)) *
                    dVar19) * 0.5;
        __position._M_current = *(double **)((long)__return_storage_ptr__ + 8);
        if (__position._M_current == *(double **)((long)__return_storage_ptr__ + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                     (double *)&local_178);
        }
        else {
          *__position._M_current =
               local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
               .m_data.array[0];
          *(double **)((long)__return_storage_ptr__ + 8) = __position._M_current + 1;
        }
        free(local_238.m_xpr);
      }
      uVar9 = uVar1;
    } while (uVar1 != uVar11);
  }
  free((void *)local_1f8._0_8_);
  free(local_248);
  return (vector<double,_std::allocator<double>_> *)
         (vector<double,std::allocator<double>> *)__return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_approx(long Npoints)
    {
        std::vector<double> roots;
        // Vector of values in the range [-1,1] as roots of a high-order Chebyshev
        Eigen::VectorXd xpts_n11 = (Eigen::VectorXd::LinSpaced(Npoints + 1, 0, Npoints)*EIGEN_PI / Npoints).array().cos();
        // Scale values into real-world values
        Eigen::VectorXd ypts = y_recurrence_xscaled(xpts_n11);
        // Eigen::MatrixXd buf(Npoints+1, 2); buf.col(0) = xpts; buf.col(1) = ypts; std::cout << buf << std::endl;
        for (size_t i = 0; i < Npoints - 1; ++i) {
            // The change of sign guarantees at least one root between indices i and i+1
            double y1 = ypts(i), y2 = ypts(i + 1);
            bool signchange = (std::signbit(y1) != std::signbit(y2));
            if (signchange) {
                double xscaled = xpts_n11(i);

                // Fit a quadratic given three points; i and i+1 bracket the root, so need one more constraint
                // i0 is the leftmost of the three indices that will be used; when i == 0, use
                // indices i,i+1,i+2, otherwise i-1,i,i+1
                size_t i0 = (i >= 1) ? i - 1 : i;
                Eigen::Vector3d r;
                r << ypts(i0), ypts(i0 + 1), ypts(i0 + 2);
                Eigen::Matrix3d A;
                for (std::size_t irow = 0; irow < 3; ++irow) {
                    double _x = xpts_n11(i0 + irow);
                    A.row(irow) << _x*_x, _x, 1;
                }
                // abc holds the coefficients a,b,c for y = a*x^2 + b*x + c
                Eigen::VectorXd abc = A.colPivHouseholderQr().solve(r);
                double a = abc[0], b = abc[1], c = abc[2];

                // Solve the quadratic and find the root you want
                double x1 = (-b + sqrt(b*b - 4 * a*c)) / (2 * a);
                double x2 = (-b - sqrt(b*b - 4 * a*c)) / (2 * a);
                bool x1_in_range = is_in_closed_range(xpts_n11(i), xpts_n11(i + 1), x1);
                bool x2_in_range = is_in_closed_range(xpts_n11(i), xpts_n11(i + 1), x2);

                // Double check that only one root is within the range
                if (x1_in_range && !x2_in_range) {
                    xscaled = x1;
                }
                else if (x2_in_range && !x1_in_range) {
                    xscaled = x2;
                }
                else {
                    xscaled = 1e99;
                }

                // Rescale back into real-world values
                double x = ((m_xmax - m_xmin)*xscaled + (m_xmax + m_xmin)) / 2.0;
                roots.push_back(x);
            }
            else {
                // TODO: locate other roots based on derivative considerations
            }
        }
        return roots;
    }